

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_size::test_method(addrman_size *this)

{
  long lVar1;
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  initializer_list<CAddress> __l_01;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffef48;
  direct_or_indirect *in_stack_ffffffffffffef50;
  CAddress *in_stack_ffffffffffffef58;
  _Optional_payload_base<bool> _Var3;
  _Optional_base<bool,_true,_true> _Var4;
  _Optional_payload_base<Network> in_stack_ffffffffffffef68;
  CService *in_stack_ffffffffffffef70;
  CAddress *in_stack_ffffffffffffef78;
  const_string *in_stack_ffffffffffffef80;
  NodeContext *in_stack_ffffffffffffef88;
  iterator in_stack_ffffffffffffef90;
  string *in_stack_ffffffffffffef98;
  string *in_stack_ffffffffffffefa0;
  undefined8 in_stack_fffffffffffff030;
  uint16_t port;
  undefined1 *local_f10;
  undefined1 *local_dc8;
  undefined1 *local_d40;
  addrman_size *this_local;
  direct_or_indirect local_bb0;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [64];
  direct_or_indirect local_b50;
  undefined1 local_b40 [16];
  undefined1 local_b30 [68];
  undefined1 local_aec [12];
  size_t local_ae0;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [68];
  undefined1 local_a84 [12];
  size_t local_a78;
  undefined1 local_a70 [16];
  undefined1 local_a60 [68];
  undefined1 local_a1c [12];
  size_t local_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [64];
  undefined1 local_9b8 [8];
  undefined8 local_9b0;
  undefined1 local_9a8 [16];
  undefined1 local_998 [64];
  const_string local_958 [2];
  lazy_ostream local_938 [4];
  assertion_result local_8f8 [2];
  allocator<char> local_8bd;
  undefined1 local_8bc [12];
  size_t local_8b0;
  undefined1 local_8a8 [16];
  undefined1 local_898 [68];
  undefined1 local_854 [12];
  size_t local_848;
  undefined1 local_840 [16];
  undefined1 local_830 [64];
  direct_or_indirect local_7f0;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [64];
  direct_or_indirect local_790;
  undefined1 local_780 [16];
  undefined1 local_770 [68];
  undefined1 local_72c [12];
  size_t local_720;
  undefined1 local_718 [16];
  undefined1 local_708 [64];
  undefined1 local_6c8 [8];
  undefined8 local_6c0;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [64];
  const_string local_668 [2];
  lazy_ostream local_648 [4];
  assertion_result local_608 [2];
  allocator<char> local_5c9;
  const_string local_5c8 [2];
  lazy_ostream local_5a8 [2];
  assertion_result local_588 [2];
  const_string local_550 [2];
  lazy_ostream local_530 [4];
  assertion_result local_4f0 [2];
  allocator<char> local_4b5;
  undefined1 local_4b4 [12];
  size_t local_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [64];
  direct_or_indirect local_450;
  undefined1 local_440 [16];
  undefined1 local_430 [68];
  undefined1 local_3ec [12];
  size_t local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [64];
  undefined1 local_388 [8];
  undefined8 local_380;
  undefined1 local_378 [16];
  undefined1 local_368 [67];
  allocator<char> local_325;
  int32_t local_324;
  __single_object addrman;
  optional<Network> local_318;
  optional<Network> local_310 [4];
  optional<Network> local_2f0 [3];
  optional<Network> local_2d8;
  optional<Network> local_2d0 [2];
  optional<Network> local_2c0 [2];
  optional<Network> local_2b0 [2];
  optional<Network> local_2a0;
  undefined1 local_298 [56];
  undefined1 local_260 [40];
  CAddress addr3;
  CService i2p_addr;
  undefined1 local_1b8 [56];
  undefined1 local_180 [72];
  CAddress addr2;
  undefined1 local_100 [56];
  undefined1 local_c8 [72];
  CAddress addr1;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_324 = GetCheckRatio(in_stack_ffffffffffffef88);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_ffffffffffffef80,(bool *)in_stack_ffffffffffffef78,
             (int *)in_stack_ffffffffffffef70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef98,(char *)in_stack_ffffffffffffef90,
             (allocator<char> *)in_stack_ffffffffffffef88);
  ResolveIP(in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef48);
  std::allocator<char>::~allocator(&local_325);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(&local_2a0);
    std::optional<bool>::optional((optional<bool> *)(local_388 + 6));
    local_380 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,(optional<bool>)_Var3);
    local_388._0_4_ = 0;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c66917;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_388;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_368,local_378,0x472,1,2,&local_380);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_3ec._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    _Var4._M_payload.super__Optional_payload_base<bool> =
         SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::optional<bool>::optional((optional<bool> *)(local_3ec + 6));
    local_3e0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (optional<bool>)_Var4._M_payload.super__Optional_payload_base<bool>);
    local_3ec._0_4_ = 0;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c66917;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_3ec;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3c8,local_3d8,0x473,1,2,&local_3e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(local_2b0);
    local_450.direct[5] = '\x01';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_450._8_8_ =
         AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                       (optional<Network>)in_stack_ffffffffffffef68,
                       (_Optional_base<bool,_true,_true>)
                       SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_450._0_4_ = 0;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c66917;
    in_stack_ffffffffffffef50 = &local_450;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_430,local_440,0x474,1,2,local_450.direct + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_4b4._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    local_4b4[5] = '\0';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_4a8 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (_Optional_base<bool,_true,_true>)
                              SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_4b4._0_4_ = 0;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c66917;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_4b4;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_490,local_4a0,0x475,1,2,&local_4a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef98,(char *)in_stack_ffffffffffffef90,
             (allocator<char> *)in_stack_ffffffffffffef88);
  ResolveService(in_stack_ffffffffffffef98,(uint16_t)((ulong)in_stack_fffffffffffff030 >> 0x30));
  CAddress::CAddress(in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
                     (ServiceFlags)in_stack_ffffffffffffef68);
  CService::~CService((CService *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef48);
  std::allocator<char>::~allocator(&local_4b5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    CAddress::CAddress(in_stack_ffffffffffffef58,
                       (CAddress *)&in_stack_ffffffffffffef50->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    __l._M_len = (size_type)in_stack_ffffffffffffef98;
    __l._M_array = in_stack_ffffffffffffef90;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef88,__l,
               (allocator_type *)in_stack_ffffffffffffef80);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffef58,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffef50->indirect_contents,(CNetAddr *)in_stack_ffffffffffffef48
                 ,(seconds)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58,
               SUB81((ulong)in_stack_ffffffffffffef50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    in_stack_ffffffffffffef48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_530,local_550,0x479,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef58);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    local_d40 = local_c8;
    do {
      local_d40 = local_d40 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
    } while (local_d40 != local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffef58,
                  (CService *)&in_stack_ffffffffffffef50->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58,
               SUB81((ulong)in_stack_ffffffffffffef50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    in_stack_ffffffffffffef48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_588,local_5a8,local_5c8,0x47a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    port = (uint16_t)((ulong)in_stack_fffffffffffff030 >> 0x30);
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef98,(char *)in_stack_ffffffffffffef90,
             (allocator<char> *)in_stack_ffffffffffffef88);
  ResolveService(in_stack_ffffffffffffef98,port);
  CAddress::CAddress(in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
                     (ServiceFlags)in_stack_ffffffffffffef68);
  CService::~CService((CService *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef48);
  std::allocator<char>::~allocator(&local_5c9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    CAddress::CAddress(in_stack_ffffffffffffef58,
                       (CAddress *)&in_stack_ffffffffffffef50->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    __l_00._M_len = (size_type)in_stack_ffffffffffffef98;
    __l_00._M_array = in_stack_ffffffffffffef90;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef88,__l_00,
               (allocator_type *)in_stack_ffffffffffffef80);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffef58,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffef50->indirect_contents,(CNetAddr *)in_stack_ffffffffffffef48
                 ,(seconds)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58,
               SUB81((ulong)in_stack_ffffffffffffef50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    in_stack_ffffffffffffef48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_608,local_648,local_668,0x47c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef58);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    local_dc8 = local_180;
    do {
      local_dc8 = local_dc8 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
    } while (local_dc8 != local_1b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(local_2c0);
    std::optional<bool>::optional((optional<bool> *)(local_6c8 + 6));
    local_6c0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,(optional<bool>)_Var3);
    local_6c8._0_4_ = 2;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c2381d;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_6c8;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_6a8,local_6b8,0x47e,1,2,&local_6c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_72c._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    _Var4._M_payload.super__Optional_payload_base<bool> =
         SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::optional<bool>::optional((optional<bool> *)(local_72c + 6));
    local_720 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (optional<bool>)_Var4._M_payload.super__Optional_payload_base<bool>);
    local_72c._0_4_ = 2;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c2381d;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_72c;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_708,local_718,0x47f,1,2,&local_720);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(local_2d0);
    local_790.direct[5] = '\x01';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_790._8_8_ =
         AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                       (optional<Network>)in_stack_ffffffffffffef68,
                       (_Optional_base<bool,_true,_true>)
                       SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_790._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = &local_790;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_770,local_780,0x480,1,2,local_790.direct + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(&local_2d8);
    local_7f0.direct[5] = '\0';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_7f0._8_8_ =
         AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                       (optional<Network>)in_stack_ffffffffffffef68,
                       (_Optional_base<bool,_true,_true>)
                       SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_7f0._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = &local_7f0;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_7d0,local_7e0,0x481,1,2,local_7f0.direct + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_854._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    local_854[5] = '\x01';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_848 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (_Optional_base<bool,_true,_true>)
                              SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_854._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_854;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_830,local_840,0x482,1,2,&local_848);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_8bc._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    local_8bc[5] = '\0';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_8b0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (_Optional_base<bool,_true,_true>)
                              SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_8bc._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_8bc;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_898,local_8a8,0x483,1,2,&local_8b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CService::CService((CService *)in_stack_ffffffffffffef48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef98,(char *)in_stack_ffffffffffffef90,
             (allocator<char> *)in_stack_ffffffffffffef88);
  CNetAddr::SetSpecial
            (&in_stack_ffffffffffffef70->super_CNetAddr,(string *)in_stack_ffffffffffffef68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef48);
  std::allocator<char>::~allocator(&local_8bd);
  CService::CService(&in_stack_ffffffffffffef58->super_CService,
                     (CService *)&in_stack_ffffffffffffef50->indirect_contents);
  CAddress::CAddress(in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
                     (ServiceFlags)in_stack_ffffffffffffef68);
  CService::~CService((CService *)in_stack_ffffffffffffef48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    CAddress::CAddress(in_stack_ffffffffffffef58,
                       (CAddress *)&in_stack_ffffffffffffef50->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    __l_01._M_len = (size_type)in_stack_ffffffffffffef98;
    __l_01._M_array = in_stack_ffffffffffffef90;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef88,__l_01,
               (allocator_type *)in_stack_ffffffffffffef80);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffef58,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffef50->indirect_contents,(CNetAddr *)in_stack_ffffffffffffef48
                 ,(seconds)in_stack_ffffffffffffef68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58,
               SUB81((ulong)in_stack_ffffffffffffef50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    in_stack_ffffffffffffef48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f8,local_938,local_958,0x489,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffef58);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffef48);
    local_f10 = local_260;
    do {
      local_f10 = local_f10 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
    } while (local_f10 != local_298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    _Var3 = SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(local_2f0);
    std::optional<bool>::optional((optional<bool> *)(local_9b8 + 6));
    local_9b0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,(optional<bool>)_Var3);
    local_9b8._0_4_ = 3;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c9d877;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_9b8;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_998,local_9a8,0x48a,1,2,&local_9b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_a1c._8_4_ = 1;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    _Var4._M_payload.super__Optional_payload_base<bool> =
         SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::optional<bool>::optional((optional<bool> *)(local_a1c + 6));
    local_a10 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (optional<bool>)_Var4._M_payload.super__Optional_payload_base<bool>);
    local_a1c._0_4_ = 2;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c2381d;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_a1c;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_IPV4, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_9f8,local_a08,0x48b,1,2,&local_a10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_a84._8_4_ = 4;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    _Var4._M_payload.super__Optional_payload_base<bool> =
         SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0);
    std::optional<bool>::optional((optional<bool> *)(local_a84 + 6));
    local_a78 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (optional<bool>)_Var4._M_payload.super__Optional_payload_base<bool>);
    local_a84._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_a84;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_I2P, std::nullopt)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_a60,local_a70,0x48c,1,2,&local_a78);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    local_aec._8_4_ = 4;
    std::optional<Network>::optional<Network,_true>
              ((optional<Network> *)in_stack_ffffffffffffef58,
               (Network *)in_stack_ffffffffffffef50->direct);
    local_aec[5] = '\x01';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_ae0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffef68,
                              (_Optional_base<bool,_true,_true>)
                              SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_aec._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = (direct_or_indirect *)local_aec;
    in_stack_ffffffffffffef48 = "addrman->Size( NET_I2P, true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_ac8,local_ad8,0x48d,1,2,&local_ae0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(local_310);
    local_b50.direct[5] = '\x01';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_b50._8_8_ =
         AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                       (optional<Network>)in_stack_ffffffffffffef68,
                       (_Optional_base<bool,_true,_true>)
                       SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_b50._0_4_ = 2;
    in_stack_ffffffffffffef58 = (CAddress *)0x1c2381d;
    in_stack_ffffffffffffef50 = &local_b50;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_b30,local_b40,0x48e,1,2,local_b50.direct + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
               (size_t)in_stack_ffffffffffffef78,(const_string *)in_stack_ffffffffffffef70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffef50->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffef48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58,
               in_stack_ffffffffffffef50->direct,(unsigned_long)in_stack_ffffffffffffef48);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef48);
    std::optional<Network>::optional(&local_318);
    local_bb0.direct[5] = '\0';
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffef58,(bool *)in_stack_ffffffffffffef50->direct
              );
    local_bb0._8_8_ =
         AddrMan::Size((AddrMan *)&in_stack_ffffffffffffef50->indirect_contents,
                       (optional<Network>)in_stack_ffffffffffffef68,
                       (_Optional_base<bool,_true,_true>)
                       SUB82((ulong)in_stack_ffffffffffffef58 >> 0x30,0));
    local_bb0._0_4_ = 1;
    in_stack_ffffffffffffef58 = (CAddress *)0x1bc11bb;
    in_stack_ffffffffffffef50 = &local_bb0;
    in_stack_ffffffffffffef48 = "addrman->Size( std::nullopt, false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_b90,local_ba0,0x48f,1,2,local_bb0.direct + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
  CService::~CService((CService *)in_stack_ffffffffffffef48);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef48);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef48);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffef58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_size)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    const CNetAddr source = ResolveIP("252.2.2.2");

    // empty addrman
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 0U);

    // add two ipv4 addresses, one to tried and new
    const CAddress addr1{ResolveService("250.1.1.1", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr1}, source));
    BOOST_CHECK(addrman->Good(addr1));
    const CAddress addr2{ResolveService("250.1.1.2", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr2}, source));

    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 1U);

    // add one i2p address to new
    CService i2p_addr;
    i2p_addr.SetSpecial("UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P");
    const CAddress addr3{i2p_addr, NODE_NONE};
    BOOST_CHECK(addrman->Add({addr3}, source));
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 3U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/std::nullopt), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
}